

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::
DecodeConnectivity(MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>
                   *this)

{
  unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *this_00;
  int64_t *piVar1;
  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
  *this_01;
  MeshEdgebreakerTraversalPredictiveDecoder *this_02;
  uint uVar2;
  uint uVar3;
  DecoderBuffer *pDVar4;
  long lVar5;
  pointer piVar6;
  pointer pTVar7;
  pointer pHVar8;
  pointer pIVar9;
  uint *puVar10;
  uint uVar11;
  uint num_symbols;
  bool bVar12;
  ushort uVar13;
  int32_t iVar14;
  int iVar15;
  int iVar16;
  MeshEdgebreakerDecoder *pMVar17;
  CornerTable *pCVar18;
  undefined4 extraout_var;
  pointer pAVar19;
  ulong uVar20;
  ulong uVar21;
  uint *puVar22;
  int iVar23;
  CornerIndex CVar24;
  long lVar25;
  pointer __p;
  uint32_t num_encoded_split_symbols;
  uint32_t num_encoded_symbols;
  uint32_t num_faces;
  uint32_t num_encoded_vertices;
  DecoderBuffer traversal_end_buffer;
  int local_8c;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  DecoderBuffer local_68;
  
  this->num_new_vertices_ = 0;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->new_to_parent_vertex_map_)._M_h);
  pMVar17 = this->decoder_;
  uVar2._0_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar2._1_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  uVar2._2_2_ = *(undefined2 *)&(pMVar17->super_MeshDecoder).super_PointCloudDecoder.field_0x4a;
  if (((uint)(pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_minor_ |
      (uVar2 & 0xff) << 8) < 0x202) {
    pDVar4 = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_;
    if ((byte)uVar2 < 2) {
      lVar25 = pDVar4->pos_ + 4;
      if (pDVar4->data_size_ < lVar25) {
        return false;
      }
      local_68.data_._0_4_ = *(int *)(pDVar4->data_ + pDVar4->pos_);
      pDVar4->pos_ = lVar25;
    }
    else {
      bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,(uint *)&local_68,pDVar4);
      if (!bVar12) {
        return false;
      }
      pMVar17 = this->decoder_;
      uVar2._0_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    }
    this->num_new_vertices_ = (int)local_68.data_;
  }
  pDVar4 = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((byte)uVar2 < 2) {
    lVar25 = pDVar4->pos_ + 4;
    if (pDVar4->data_size_ < lVar25) {
      return false;
    }
    local_70 = *(uint *)(pDVar4->data_ + pDVar4->pos_);
    pDVar4->pos_ = lVar25;
    this->num_encoded_vertices_ = local_70;
  }
  else {
    bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_70,pDVar4);
    if (!bVar12) {
      return false;
    }
    pMVar17 = this->decoder_;
    uVar2._0_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    this->num_encoded_vertices_ = local_70;
    if (1 < (byte)uVar2) {
      bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>
                         (1,&local_74,(pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_);
      if (!bVar12) {
        return false;
      }
      goto LAB_00122bbe;
    }
  }
  pDVar4 = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  lVar25 = pDVar4->pos_ + 4;
  if (pDVar4->data_size_ < lVar25) {
    return false;
  }
  local_74 = *(uint *)(pDVar4->data_ + pDVar4->pos_);
  pDVar4->pos_ = lVar25;
LAB_00122bbe:
  uVar3 = local_74;
  if (local_74 < 0x55555556) {
    uVar2 = this->num_encoded_vertices_;
    if ((uVar2 <= local_74 * 3) &&
       ((ulong)(local_74 * 3 >> 1) <= (ulong)(((long)(int)uVar2 + -1) * (long)(int)uVar2) >> 1)) {
      pMVar17 = this->decoder_;
      pDVar4 = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_;
      lVar5 = pDVar4->pos_;
      lVar25 = lVar5 + 1;
      if (lVar25 <= pDVar4->data_size_) {
        uVar2._0_1_ = pDVar4->data_[lVar5];
        pDVar4->pos_ = lVar25;
        if ((pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
          if (pDVar4->data_size_ < lVar5 + 5) {
            return false;
          }
          local_78 = *(uint *)(pDVar4->data_ + lVar25);
          pDVar4->pos_ = lVar5 + 5;
        }
        else {
          bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_78,pDVar4);
          if (!bVar12) {
            return false;
          }
        }
        num_symbols = local_78;
        if ((local_78 <= uVar3) && (uVar3 <= (uint)((ulong)local_78 * 0x2aaaaaaab >> 0x21))) {
          pDVar4 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
          if ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.version_major_ < 2) {
            lVar25 = pDVar4->pos_ + 4;
            if (pDVar4->data_size_ < lVar25) {
              return false;
            }
            local_7c = *(uint *)(pDVar4->data_ + pDVar4->pos_);
            pDVar4->pos_ = lVar25;
          }
          else {
            bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_7c,pDVar4);
            if (!bVar12) {
              return false;
            }
          }
          uVar11 = local_7c;
          if (local_7c <= num_symbols) {
            piVar6 = (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_finish != piVar6) {
              (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = piVar6;
            }
            pCVar18 = (CornerTable *)operator_new(0xa8);
            CornerTable::CornerTable(pCVar18);
            this_00 = &this->corner_table_;
            local_68.data_ = (char *)0x0;
            std::__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            reset((__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                  this_00,pCVar18);
            std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::
            ~unique_ptr((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                        &local_68);
            if ((this->corner_table_)._M_t.
                super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
                _M_t.
                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl !=
                (CornerTable *)0x0) {
              piVar6 = (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish != piVar6) {
                (this->processed_corner_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = piVar6;
              }
              std::vector<int,_std::allocator<int>_>::reserve
                        (&this->processed_corner_ids_,(ulong)uVar3);
              piVar6 = (this->processed_connectivity_corners_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              if ((this->processed_connectivity_corners_).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish != piVar6) {
                (this->processed_connectivity_corners_).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = piVar6;
              }
              std::vector<int,_std::allocator<int>_>::reserve
                        (&this->processed_connectivity_corners_,(ulong)uVar3);
              pTVar7 = (this->topology_split_data_).
                       super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->topology_split_data_).
                  super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pTVar7) {
                (this->topology_split_data_).
                super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
                ._M_impl.super__Vector_impl_data._M_finish = pTVar7;
              }
              pHVar8 = (this->hole_event_data_).
                       super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((this->hole_event_data_).
                  super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>.
                  _M_impl.super__Vector_impl_data._M_finish != pHVar8) {
                (this->hole_event_data_).
                super__Vector_base<draco::HoleEventData,_std::allocator<draco::HoleEventData>_>.
                _M_impl.super__Vector_impl_data._M_finish = pHVar8;
              }
              pIVar9 = (this->init_corners_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                   (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              (this->init_face_configurations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              if ((this->init_corners_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pIVar9) {
                (this->init_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pIVar9;
              }
              this->last_symbol_id_ = -1;
              this->last_vert_id_ = -1;
              this->last_face_id_ = -1;
              this_01 = &this->attribute_data_;
              std::
              vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
              ::_M_erase_at_end(this_01,(this->attribute_data_).
                                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
              std::
              vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
              ::resize(this_01,(ulong)(byte)uVar2);
              bVar12 = CornerTable::Reset((this->corner_table_)._M_t.
                                          super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                          .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                          _M_head_impl,uVar3,this->num_encoded_vertices_ + uVar11);
              if (bVar12) {
                std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                          (&this->is_vert_hole_,(ulong)(this->num_encoded_vertices_ + uVar11),true);
                pMVar17 = this->decoder_;
                uVar3._0_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_major_;
                uVar3._1_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
                uVar3._2_2_ = *(undefined2 *)
                               &(pMVar17->super_MeshDecoder).super_PointCloudDecoder.field_0x4a;
                if (((uint)(pMVar17->super_MeshDecoder).super_PointCloudDecoder.version_minor_ |
                    (uVar3 & 0xff) << 8) < 0x202) {
                  pDVar4 = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                  if ((byte)(undefined1)uVar3 < 2) {
                    lVar25 = pDVar4->pos_ + 4;
                    if (pDVar4->data_size_ < lVar25) {
                      return false;
                    }
                    local_6c = *(uint *)(pDVar4->data_ + pDVar4->pos_);
                    pDVar4->pos_ = lVar25;
                  }
                  else {
                    bVar12 = anon_unknown_60::DecodeVarintUnsigned<unsigned_int>(1,&local_6c,pDVar4)
                    ;
                    if (!bVar12) {
                      return false;
                    }
                  }
                  if (local_6c == 0) {
                    return false;
                  }
                  pDVar4 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                  if (pDVar4->data_size_ - pDVar4->pos_ < (long)(ulong)local_6c) {
                    return false;
                  }
                  DecoderBuffer::DecoderBuffer(&local_68);
                  pDVar4 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                  lVar25 = (ulong)local_6c + pDVar4->pos_;
                  DecoderBuffer::Init(&local_68,pDVar4->data_ + lVar25,pDVar4->data_size_ - lVar25,
                                      pDVar4->bitstream_version_);
                  local_8c = DecodeHoleAndTopologySplitEvents(this,&local_68);
                  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
                  iVar14 = local_8c;
                }
                else {
                  iVar14 = DecodeHoleAndTopologySplitEvents
                                     (this,(pMVar17->super_MeshDecoder).super_PointCloudDecoder.
                                           buffer_);
                  local_8c = -1;
                }
                if (iVar14 != -1) {
                  this_02 = &this->traversal_decoder_;
                  MeshEdgebreakerTraversalDecoder::Init
                            (&this_02->super_MeshEdgebreakerTraversalDecoder,
                             &this->super_MeshEdgebreakerDecoderImplInterface);
                  iVar15 = (*(this->super_MeshEdgebreakerDecoderImplInterface).
                             _vptr_MeshEdgebreakerDecoderImplInterface[9])(this);
                  (this->traversal_decoder_).corner_table_ =
                       (CornerTable *)CONCAT44(extraout_var,iVar15);
                  (this->traversal_decoder_).num_vertices_ = uVar11 + this->num_encoded_vertices_;
                  (this->traversal_decoder_).super_MeshEdgebreakerTraversalDecoder.
                  num_attribute_data_ = (uint)(byte)uVar2;
                  DecoderBuffer::DecoderBuffer(&local_68);
                  bVar12 = MeshEdgebreakerTraversalPredictiveDecoder::Start(this_02,&local_68);
                  if ((bVar12) && (iVar15 = DecodeConnectivity(this,num_symbols), iVar15 != -1)) {
                    pDVar4 = (this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_;
                    DecoderBuffer::Init(pDVar4,local_68.data_ + local_68.pos_,
                                        local_68.data_size_ - local_68.pos_,
                                        pDVar4->bitstream_version_);
                    pMVar17 = this->decoder_;
                    uVar13._0_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.
                                   version_major_;
                    uVar13._1_1_ = (pMVar17->super_MeshDecoder).super_PointCloudDecoder.
                                   version_minor_;
                    uVar13 = uVar13 << 8 | uVar13 >> 8;
                    if (uVar13 < 0x202) {
                      piVar1 = &((pMVar17->super_MeshDecoder).super_PointCloudDecoder.buffer_)->pos_
                      ;
                      *piVar1 = *piVar1 + (long)local_8c;
                    }
                    if ((this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      pCVar18 = (this_00->_M_t).
                                super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
                      iVar23 = (int)((ulong)((long)(pCVar18->corner_to_vertex_map_).vector_.
                                                                                                      
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            *(long *)&(pCVar18->corner_to_vertex_map_).vector_) >> 2
                                    );
                      if (uVar13 < 0x201) {
                        if (iVar23 != 0) {
                          CVar24.value_ = 0;
                          do {
                            bVar12 = DecodeAttributeConnectivitiesOnFaceLegacy(this,CVar24);
                            if (!bVar12) goto LAB_001231ef;
                            CVar24.value_ = CVar24.value_ + 3;
                            pCVar18 = (this_00->_M_t).
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                      _M_head_impl;
                          } while (CVar24.value_ <
                                   (uint)((ulong)((long)(pCVar18->corner_to_vertex_map_).vector_.
                                                                                                                
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 *(long *)&(pCVar18->corner_to_vertex_map_).vector_)
                                         >> 2));
                        }
                      }
                      else if (iVar23 != 0) {
                        CVar24.value_ = 0;
                        do {
                          bVar12 = DecodeAttributeConnectivitiesOnFace(this,CVar24);
                          if (!bVar12) goto LAB_001231ef;
                          CVar24.value_ = CVar24.value_ + 3;
                          pCVar18 = (this_00->_M_t).
                                    super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl
                          ;
                        } while (CVar24.value_ <
                                 (uint)((ulong)((long)(pCVar18->corner_to_vertex_map_).vector_.
                                                                                                            
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               *(long *)&(pCVar18->corner_to_vertex_map_).vector_)
                                       >> 2));
                      }
                    }
                    MeshEdgebreakerTraversalDecoder::Done
                              (&this_02->super_MeshEdgebreakerTraversalDecoder);
                    pAVar19 = (this->attribute_data_).
                              super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish != pAVar19) {
                      uVar21 = 0;
                      do {
                        MeshAttributeCornerTable::InitEmpty
                                  (&pAVar19[uVar21].connectivity_data,
                                   (this_00->_M_t).
                                   super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                   .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)
                        ;
                        pAVar19 = (this_01->
                                  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        puVar22 = *(uint **)&pAVar19[uVar21].attribute_seam_corners.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl;
                        puVar10 = (uint *)pAVar19[uVar21].attribute_seam_corners.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish;
                        if (puVar22 != puVar10) {
                          do {
                            MeshAttributeCornerTable::AddSeamEdge
                                      (&(this_01->
                                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar21].
                                        connectivity_data,(CornerIndex)*puVar22);
                            puVar22 = puVar22 + 1;
                          } while (puVar22 != puVar10);
                          pAVar19 = (this_01->
                                    super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                        }
                        bVar12 = MeshAttributeCornerTable::RecomputeVertices
                                           (&pAVar19[uVar21].connectivity_data,(Mesh *)0x0,
                                            (PointAttribute *)0x0);
                        if (!bVar12) goto LAB_001231ef;
                        uVar21 = (ulong)((int)uVar21 + 1);
                        pAVar19 = (this->attribute_data_).
                                  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        uVar20 = ((long)(this->attribute_data_).
                                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar19
                                 >> 6) * -0x3333333333333333;
                      } while (uVar21 <= uVar20 && uVar20 - uVar21 != 0);
                    }
                    pCVar18 = (this->corner_table_)._M_t.
                              super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                              .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
                    MeshAttributeIndicesEncodingData::Init
                              (&this->pos_encoding_data_,
                               (int)((ulong)((long)(pCVar18->vertex_corners_).vector_.
                                                                                                      
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            *(long *)&(pCVar18->vertex_corners_).vector_.
                                                                                                            
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                            ) >> 2));
                    pAVar19 = (this->attribute_data_).
                              super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish != pAVar19) {
                      uVar21 = 0;
                      uVar20 = 1;
                      do {
                        pCVar18 = (this_00->_M_t).
                                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
                        iVar16 = (int)((ulong)((long)pAVar19[uVar21].connectivity_data.
                                                     vertex_to_attribute_entry_id_map_.
                                                                                                          
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pAVar19[uVar21].connectivity_data.
                                                    vertex_to_attribute_entry_id_map_.
                                                                                                        
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
                        iVar23 = (int)((ulong)((long)(pCVar18->vertex_corners_).vector_.
                                                                                                          
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(long *)&(pCVar18->vertex_corners_).vector_.
                                                                                                                
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                              ) >> 2);
                        if (iVar23 < iVar16) {
                          iVar23 = iVar16;
                        }
                        MeshAttributeIndicesEncodingData::Init
                                  (&pAVar19[uVar21].encoding_data,iVar23);
                        pAVar19 = (this->attribute_data_).
                                  super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        uVar21 = ((long)(this->attribute_data_).
                                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalPredictiveDecoder>::AttributeData>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar19
                                 >> 6) * -0x3333333333333333;
                        bVar12 = uVar20 <= uVar21;
                        lVar25 = uVar21 - uVar20;
                        uVar21 = uVar20;
                        uVar20 = (ulong)((int)uVar20 + 1);
                      } while (bVar12 && lVar25 != 0);
                    }
                    bVar12 = AssignPointsToCorners(this,iVar15);
                  }
                  else {
LAB_001231ef:
                    bVar12 = false;
                  }
                  DecoderBuffer::BitDecoder::~BitDecoder(&local_68.bit_decoder_);
                  return bVar12;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::DecodeConnectivity() {
  num_new_vertices_ = 0;
  new_to_parent_vertex_map_.clear();
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t num_new_verts;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&num_new_verts)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&num_new_verts, decoder_->buffer())) {
        return false;
      }
    }
    num_new_vertices_ = num_new_verts;
  }
#endif

  uint32_t num_encoded_vertices;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_vertices)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_vertices, decoder_->buffer())) {
      return false;
    }
  }
  num_encoded_vertices_ = num_encoded_vertices;

  uint32_t num_faces;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_faces)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, decoder_->buffer())) {
      return false;
    }
  }
  if (num_faces > std::numeric_limits<CornerIndex::ValueType>::max() / 3) {
    return false;  // Draco cannot handle this many faces.
  }

  if (static_cast<uint32_t>(num_encoded_vertices_) > num_faces * 3) {
    return false;  // There cannot be more vertices than 3 * num_faces.
  }

  // Minimum number of edges of the mesh assuming each edge is shared between
  // two faces.
  const uint32_t min_num_face_edges = 3 * num_faces / 2;

  // Maximum number of edges that can exist between |num_encoded_vertices_|.
  // This is based on graph theory assuming simple connected graph.
  const uint64_t num_encoded_vertices_64 =
      static_cast<uint64_t>(num_encoded_vertices_);
  const uint64_t max_num_vertex_edges =
      num_encoded_vertices_64 * (num_encoded_vertices_64 - 1) / 2;
  if (max_num_vertex_edges < min_num_face_edges) {
    // It is impossible to construct a manifold mesh with these properties.
    return false;
  }

  uint8_t num_attribute_data;
  if (!decoder_->buffer()->Decode(&num_attribute_data)) {
    return false;
  }

  uint32_t num_encoded_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_faces < num_encoded_symbols) {
    // Number of faces needs to be the same or greater than the number of
    // symbols (it can be greater because the initial face may not be encoded as
    // a symbol).
    return false;
  }
  const uint32_t max_encoded_faces =
      num_encoded_symbols + (num_encoded_symbols / 3);
  if (num_faces > max_encoded_faces) {
    // Faces can only be 1 1/3 times bigger than number of encoded symbols. This
    // could only happen if all new encoded components started with interior
    // triangles. E.g. A mesh with multiple tetrahedrons.
    return false;
  }

  uint32_t num_encoded_split_symbols;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!decoder_->buffer()->Decode(&num_encoded_split_symbols)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_encoded_split_symbols, decoder_->buffer())) {
      return false;
    }
  }

  if (num_encoded_split_symbols > num_encoded_symbols) {
    return false;  // Split symbols are a sub-set of all symbols.
  }

  // Decode topology (connectivity).
  vertex_traversal_length_.clear();
  corner_table_ = std::unique_ptr<CornerTable>(new CornerTable());
  if (corner_table_ == nullptr) {
    return false;
  }
  processed_corner_ids_.clear();
  processed_corner_ids_.reserve(num_faces);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(num_faces);
  topology_split_data_.clear();
  hole_event_data_.clear();
  init_face_configurations_.clear();
  init_corners_.clear();

  last_symbol_id_ = -1;
  last_face_id_ = -1;
  last_vert_id_ = -1;

  attribute_data_.clear();
  // Add one attribute data for each attribute decoder.
  attribute_data_.resize(num_attribute_data);

  if (!corner_table_->Reset(
          num_faces, num_encoded_vertices_ + num_encoded_split_symbols)) {
    return false;
  }

  // Start with all vertices marked as holes (boundaries).
  // Only vertices decoded with TOPOLOGY_C symbol (and the initial face) will
  // be marked as non hole vertices. We need to allocate the array larger
  // because split symbols can create extra vertices during the decoding
  // process (these extra vertices are then eliminated during deduplication).
  is_vert_hole_.assign(num_encoded_vertices_ + num_encoded_split_symbols, true);

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  int32_t topology_split_decoded_bytes = -1;
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    uint32_t encoded_connectivity_size;
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
      if (!decoder_->buffer()->Decode(&encoded_connectivity_size)) {
        return false;
      }
    } else {
      if (!DecodeVarint(&encoded_connectivity_size, decoder_->buffer())) {
        return false;
      }
    }
    if (encoded_connectivity_size == 0 ||
        encoded_connectivity_size > decoder_->buffer()->remaining_size()) {
      return false;
    }
    DecoderBuffer event_buffer;
    event_buffer.Init(
        decoder_->buffer()->data_head() + encoded_connectivity_size,
        decoder_->buffer()->remaining_size() - encoded_connectivity_size,
        decoder_->buffer()->bitstream_version());
    // Decode hole and topology split events.
    topology_split_decoded_bytes =
        DecodeHoleAndTopologySplitEvents(&event_buffer);
    if (topology_split_decoded_bytes == -1) {
      return false;
    }

  } else
#endif
  {
    if (DecodeHoleAndTopologySplitEvents(decoder_->buffer()) == -1) {
      return false;
    }
  }

  traversal_decoder_.Init(this);
  // Add one extra vertex for each split symbol.
  traversal_decoder_.SetNumEncodedVertices(num_encoded_vertices_ +
                                           num_encoded_split_symbols);
  traversal_decoder_.SetNumAttributeData(num_attribute_data);

  DecoderBuffer traversal_end_buffer;
  if (!traversal_decoder_.Start(&traversal_end_buffer)) {
    return false;
  }

  const int num_connectivity_verts = DecodeConnectivity(num_encoded_symbols);
  if (num_connectivity_verts == -1) {
    return false;
  }

  // Set the main buffer to the end of the traversal.
  decoder_->buffer()->Init(traversal_end_buffer.data_head(),
                           traversal_end_buffer.remaining_size(),
                           decoder_->buffer()->bitstream_version());

#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Skip topology split data that was already decoded earlier.
    decoder_->buffer()->Advance(topology_split_decoded_bytes);
  }
#endif

  // Decode connectivity of non-position attributes.
  if (!attribute_data_.empty()) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (decoder_->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 1)) {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFaceLegacy(ci)) {
          return false;
        }
      }

    } else
#endif
    {
      for (CornerIndex ci(0); ci < corner_table_->num_corners(); ci += 3) {
        if (!DecodeAttributeConnectivitiesOnFace(ci)) {
          return false;
        }
      }
    }
  }
  traversal_decoder_.Done();

  // Decode attribute connectivity.
  // Prepare data structure for decoding non-position attribute connectivity.
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    attribute_data_[i].connectivity_data.InitEmpty(corner_table_.get());
    // Add all seams.
    for (int32_t c : attribute_data_[i].attribute_seam_corners) {
      attribute_data_[i].connectivity_data.AddSeamEdge(CornerIndex(c));
    }
    // Recompute vertices from the newly added seam edges.
    if (!attribute_data_[i].connectivity_data.RecomputeVertices(nullptr,
                                                                nullptr)) {
      return false;
    }
  }

  pos_encoding_data_.Init(corner_table_->num_vertices());
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    // For non-position attributes, preallocate the vertex to value mapping
    // using the maximum number of vertices from the base corner table and the
    // attribute corner table (since the attribute decoder may use either of
    // it).
    int32_t att_connectivity_verts =
        attribute_data_[i].connectivity_data.num_vertices();
    if (att_connectivity_verts < corner_table_->num_vertices()) {
      att_connectivity_verts = corner_table_->num_vertices();
    }
    attribute_data_[i].encoding_data.Init(att_connectivity_verts);
  }
  if (!AssignPointsToCorners(num_connectivity_verts)) {
    return false;
  }
  return true;
}